

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator __thiscall
QHash<QObject_const*,QList<QCss::StyleRule>>::emplace<QList<QCss::StyleRule>const&>
          (QHash<QObject_const*,QList<QCss::StyleRule>> *this,QObject **key,
          QList<QCss::StyleRule> *args)

{
  Data<QHashPrivate::Node<const_QObject_*,_QList<QCss::StyleRule>_>_> *pDVar1;
  long in_FS_OFFSET;
  piter pVar2;
  QArrayDataPointer<QCss::StyleRule> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = *(Data<QHashPrivate::Node<const_QObject_*,_QList<QCss::StyleRule>_>_> **)this;
  if (pDVar1 == (Data<QHashPrivate::Node<const_QObject_*,_QList<QCss::StyleRule>_>_> *)0x0) {
    local_38.d = (Data *)0x0;
LAB_00376b8d:
    pDVar1 = (Data<QHashPrivate::Node<const_QObject_*,_QList<QCss::StyleRule>_>_> *)0x0;
LAB_00376bae:
    pDVar1 = QHashPrivate::Data<QHashPrivate::Node<const_QObject_*,_QList<QCss::StyleRule>_>_>::
             detached(pDVar1);
    *(Data<QHashPrivate::Node<const_QObject_*,_QList<QCss::StyleRule>_>_> **)this = pDVar1;
LAB_00376bb6:
    pVar2 = (piter)emplace_helper<QList<QCss::StyleRule>const&>(this,key,args);
    QHash<const_QObject_*,_QList<QCss::StyleRule>_>::~QHash
              ((QHash<const_QObject_*,_QList<QCss::StyleRule>_> *)&local_38);
  }
  else {
    if (1 < (uint)(((QArrayData *)&pDVar1->ref)->ref_)._q_value.super___atomic_base<int>._M_i) {
      local_38.d = (Data *)pDVar1;
      if ((((QArrayData *)&pDVar1->ref)->ref_)._q_value.super___atomic_base<int>._M_i != -1) {
        LOCK();
        (((QArrayData *)&pDVar1->ref)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)&pDVar1->ref)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        pDVar1 = *(Data<QHashPrivate::Node<const_QObject_*,_QList<QCss::StyleRule>_>_> **)this;
        if (pDVar1 == (Data<QHashPrivate::Node<const_QObject_*,_QList<QCss::StyleRule>_>_> *)0x0)
        goto LAB_00376b8d;
      }
      if (1 < (uint)(((QArrayData *)&pDVar1->ref)->ref_)._q_value.super___atomic_base<int>._M_i)
      goto LAB_00376bae;
      goto LAB_00376bb6;
    }
    if (pDVar1->size < pDVar1->numBuckets >> 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        pVar2 = (piter)emplace_helper<QList<QCss::StyleRule>const&>(this,key,args);
        return (iterator)pVar2;
      }
      goto LAB_00376c34;
    }
    local_38.d = (args->d).d;
    local_38.ptr = (args->d).ptr;
    local_38.size = (args->d).size;
    if ((Data<QHashPrivate::Node<const_QObject_*,_QList<QCss::StyleRule>_>_> *)local_38.d !=
        (Data<QHashPrivate::Node<const_QObject_*,_QList<QCss::StyleRule>_>_> *)0x0) {
      LOCK();
      (((QArrayData *)
       &((Data<QHashPrivate::Node<const_QObject_*,_QList<QCss::StyleRule>_>_> *)local_38.d)->ref)->
      ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)
            &((Data<QHashPrivate::Node<const_QObject_*,_QList<QCss::StyleRule>_>_> *)local_38.d)->
             ref)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pVar2 = (piter)emplace_helper<QList<QCss::StyleRule>>
                             (this,key,(QList<QCss::StyleRule> *)&local_38);
    QArrayDataPointer<QCss::StyleRule>::~QArrayDataPointer(&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar2;
  }
LAB_00376c34:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }